

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

char * psftp_getcwd(void)

{
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  size_t size;
  size_t local_20;
  
  local_20 = 0x100;
  pcVar1 = (char *)safemalloc(0x100,1,0);
  pcVar2 = getcwd(pcVar1,0x100);
  if (pcVar2 == (char *)0x0) {
    piVar3 = __errno_location();
    do {
      if (*piVar3 != 0x22) {
        safefree(pcVar1);
        pcVar1 = strerror(*piVar3);
        pcVar1 = dupprintf("[cwd unavailable: %s]",pcVar1);
        return pcVar1;
      }
      pcVar1 = (char *)safegrowarray(pcVar1,&local_20,1,local_20,1,false);
      pcVar2 = getcwd(pcVar1,local_20);
    } while (pcVar2 == (char *)0x0);
  }
  return pcVar2;
}

Assistant:

char *psftp_getcwd(void)
{
    char *buffer, *ret;
    size_t size = 256;

    buffer = snewn(size, char);
    while (1) {
        ret = getcwd(buffer, size);
        if (ret != NULL)
            return ret;
        if (errno != ERANGE) {
            sfree(buffer);
            return dupprintf("[cwd unavailable: %s]", strerror(errno));
        }
        /*
         * Otherwise, ERANGE was returned, meaning the buffer
         * wasn't big enough.
         */
        sgrowarray(buffer, size, size);
    }
}